

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O1

qint64 __thiscall QRingBuffer::peek(QRingBuffer *this,char *data,qint64 maxLength,qint64 pos)

{
  long lVar1;
  QRingChunk *pQVar2;
  long lVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  size_t __n;
  long lVar9;
  long lVar10;
  bool bVar11;
  
  lVar1 = (this->buffers).d.size;
  if (lVar1 == 0) {
    lVar9 = 0;
  }
  else {
    pQVar2 = (this->buffers).d.ptr;
    lVar7 = 0;
    lVar10 = 0;
    do {
      sVar4 = maxLength - lVar10;
      lVar6 = pos;
      lVar9 = lVar10;
      if (sVar4 != 0) {
        lVar3 = *(long *)((long)&pQVar2->headOffset + lVar7);
        lVar8 = *(long *)((long)&pQVar2->tailOffset + lVar7) - lVar3;
        lVar6 = pos - lVar8;
        if (pos < lVar8) {
          __n = lVar8 - pos;
          if ((long)sVar4 <= lVar8 - pos) {
            __n = sVar4;
          }
          pcVar5 = *(char **)((long)&(pQVar2->chunk).d.ptr + lVar7);
          if (pcVar5 == (char *)0x0) {
            pcVar5 = "";
          }
          memcpy(data + lVar10,pcVar5 + lVar3 + pos,__n);
          lVar6 = 0;
          lVar9 = __n + lVar10;
        }
      }
    } while ((maxLength != lVar10) &&
            (bVar11 = lVar1 * 0x28 + -0x28 != lVar7, pos = lVar6, lVar7 = lVar7 + 0x28,
            lVar10 = lVar9, bVar11));
  }
  return lVar9;
}

Assistant:

qint64 QRingBuffer::peek(char *data, qint64 maxLength, qint64 pos) const
{
    Q_ASSERT(maxLength >= 0 && pos >= 0);

    qint64 readSoFar = 0;
    for (const QRingChunk &chunk : buffers) {
        if (readSoFar == maxLength)
            break;

        qint64 blockLength = chunk.size();
        if (pos < blockLength) {
            blockLength = qMin(blockLength - pos, maxLength - readSoFar);
            memcpy(data + readSoFar, chunk.data() + pos, blockLength);
            readSoFar += blockLength;
            pos = 0;
        } else {
            pos -= blockLength;
        }
    }

    return readSoFar;
}